

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

State __thiscall QSpinBoxValidator::validate(QSpinBoxValidator *this,QString *input,int *pos)

{
  long lVar1;
  char cVar2;
  State SVar3;
  char16_t *pcVar4;
  QAbstractSpinBoxPrivate *pQVar5;
  QStringView QVar6;
  QStringView QVar7;
  
  pQVar5 = this->dptr;
  lVar1 = (pQVar5->specialValueText).d.size;
  if ((lVar1 != 0) && ((input->d).size == lVar1)) {
    QVar6.m_data = (input->d).ptr;
    QVar6.m_size = lVar1;
    QVar7.m_data = (pQVar5->specialValueText).d.ptr;
    QVar7.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar6,QVar7);
    if (cVar2 != '\0') {
      return Acceptable;
    }
  }
  if ((pQVar5->prefix).d.size != 0) {
    cVar2 = QString::startsWith((QString *)input,(int)pQVar5 + 600);
    pQVar5 = this->dptr;
    if (cVar2 == '\0') {
      pcVar4 = (pQVar5->prefix).d.ptr;
      if (pcVar4 == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QString::_empty;
      }
      QString::insert((longlong)input,(QChar *)0x0,(longlong)pcVar4);
      pQVar5 = this->dptr;
      *pos = *pos + (int)(pQVar5->prefix).d.size;
    }
  }
  if ((pQVar5->suffix).d.size != 0) {
    cVar2 = QString::endsWith((QString *)input,(int)pQVar5 + 0x270);
    if (cVar2 == '\0') {
      QString::append((QString *)input);
    }
  }
  SVar3 = (**(code **)(*(long *)&this->qptr->super_QWidget + 0x1a0))(this->qptr,input,pos);
  return SVar3;
}

Assistant:

QValidator::State QSpinBoxValidator::validate(QString &input, int &pos) const
{
    if (dptr->specialValueText.size() > 0 && input == dptr->specialValueText)
        return QValidator::Acceptable;

    if (!dptr->prefix.isEmpty() && !input.startsWith(dptr->prefix)) {
        input.prepend(dptr->prefix);
        pos += dptr->prefix.size();
    }

    if (!dptr->suffix.isEmpty() && !input.endsWith(dptr->suffix))
        input.append(dptr->suffix);

    return qptr->validate(input, pos);
}